

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::CreationTest::iterate(CreationTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  undefined4 extraout_var;
  char *description;
  GLuint i;
  long lVar8;
  qpTestResult testResult;
  TestContext *this_00;
  GLuint vertex_arrays_dsa [2];
  GLuint vertex_arrays_legacy [2];
  int local_1c0 [4];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar2) || (bVar3)) {
    local_1c0[2] = 0;
    local_1c0[3] = 0;
    local_1c0[0] = 0;
    local_1c0[1] = 0;
    (**(code **)(lVar7 + 0x708))(2);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGenVertexArrays have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x6c);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    bVar2 = true;
    lVar8 = 0;
    do {
      cVar4 = (**(code **)(lVar7 + 0xcd8))(local_1c0[lVar8 + 2]);
      if (cVar4 != '\0') {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "GenVertexArrays has created default objects, but it should create only a names."
                   ,0x4f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar2 = false;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    (**(code **)(lVar7 + 0x410))(2,local_1c0);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glCreateVertexArrays have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x7e);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    lVar8 = 0;
    do {
      cVar4 = (**(code **)(lVar7 + 0xcd8))(local_1c0[lVar8]);
      if (cVar4 == '\0') {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"CreateVertexArrays has not created default objects.",0x33);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar2 = false;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    lVar8 = 0;
    do {
      if (*(int *)((long)local_1c0 + lVar8 + 8) != 0) {
        (**(code **)(lVar7 + 0x490))(1);
        *(undefined4 *)((long)local_1c0 + lVar8 + 8) = 0;
      }
      if (*(int *)((long)local_1c0 + lVar8) != 0) {
        (**(code **)(lVar7 + 0x490))(1);
        *(undefined4 *)((long)local_1c0 + lVar8) = 0;
      }
      lVar8 = lVar8 + 4;
    } while (lVar8 == 4);
    do {
      iVar5 = (**(code **)(lVar7 + 0x800))();
    } while (iVar5 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar2) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* VertexArrays' objects */
	static const glw::GLuint vertex_arrays_count = 2;

	glw::GLuint vertex_arrays_legacy[vertex_arrays_count] = {};
	glw::GLuint vertex_arrays_dsa[vertex_arrays_count]	= {};

	try
	{
		/* Check legacy state creation. */
		gl.genVertexArrays(vertex_arrays_count, vertex_arrays_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays have failed");

		for (glw::GLuint i = 0; i < vertex_arrays_count; ++i)
		{
			if (gl.isVertexArray(vertex_arrays_legacy[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GenVertexArrays has created default objects, but it should create only a names."
					<< tcu::TestLog::EndMessage;
			}
		}

		/* Check direct state creation. */
		gl.createVertexArrays(vertex_arrays_count, vertex_arrays_dsa);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateVertexArrays have failed");

		for (glw::GLuint i = 0; i < vertex_arrays_count; ++i)
		{
			if (!gl.isVertexArray(vertex_arrays_dsa[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "CreateVertexArrays has not created default objects."
													<< tcu::TestLog::EndMessage;
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint i = 0; i < vertex_arrays_count; ++i)
	{
		if (vertex_arrays_legacy[i])
		{
			gl.deleteVertexArrays(1, &vertex_arrays_legacy[i]);

			vertex_arrays_legacy[i] = 0;
		}

		if (vertex_arrays_dsa[i])
		{
			gl.deleteVertexArrays(1, &vertex_arrays_dsa[i]);

			vertex_arrays_dsa[i] = 0;
		}
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}